

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

error_or<int> *
pstore::file::file_handle::close_noex(error_or<int> *__return_storage_ptr__,oshandle file)

{
  int iVar1;
  int *piVar2;
  error_category *peVar3;
  error_code *peVar4;
  
  if ((file != -1) && (iVar1 = ::close(file), iVar1 == -1)) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::generic_category();
    __return_storage_ptr__->has_error_ = true;
    peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                       (__return_storage_ptr__);
    peVar4->_M_value = iVar1;
    peVar4->_M_cat = peVar3;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_error_ = false;
  piVar2 = error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(__return_storage_ptr__);
  *piVar2 = -1;
  return __return_storage_ptr__;
}

Assistant:

auto file_handle::close_noex (oshandle const file) -> error_or<oshandle> {
            if (file != invalid_oshandle && ::close (file) == -1) {
                return error_or<oshandle>{make_error_code (pstore::errno_erc (errno))};
            }
            return error_or<oshandle>{in_place, invalid_oshandle};
        }